

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

void __thiscall
Catch::IStreamingReporter::listReporters
          (IStreamingReporter *this,
          vector<Catch::ReporterDescription,_std::allocator<Catch::ReporterDescription>_>
          *descriptions,IConfig *config)

{
  pointer pRVar1;
  size_type sVar2;
  pointer pRVar3;
  pointer pRVar4;
  int iVar5;
  pointer pRVar6;
  Column *pCVar7;
  Column *other;
  pointer pRVar8;
  size_t newWidth;
  pointer text;
  Columns local_d8;
  undefined1 local_c0 [32];
  Column local_a0;
  Column local_68;
  
  std::operator<<((ostream *)&std::cout,"Available reporters:\n");
  text = (descriptions->
         super__Vector_base<Catch::ReporterDescription,_std::allocator<Catch::ReporterDescription>_>
         )._M_impl.super__Vector_impl_data._M_start;
  pRVar1 = (descriptions->
           super__Vector_base<Catch::ReporterDescription,_std::allocator<Catch::ReporterDescription>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  pRVar8 = text;
  pRVar6 = text;
  pRVar3 = text;
  if (text != pRVar1) {
    while (pRVar6 = pRVar8, pRVar8 = pRVar3 + 1, pRVar8 != pRVar1) {
      pRVar4 = pRVar3 + 1;
      pRVar3 = pRVar8;
      if ((pRVar4->name)._M_string_length <= (pRVar6->name)._M_string_length) {
        pRVar8 = pRVar6;
      }
    }
  }
  sVar2 = (pRVar6->name)._M_string_length;
  newWidth = sVar2 + 5;
  for (; text != pRVar1; text = text + 1) {
    iVar5 = (*config->_vptr_IConfig[0x14])();
    if (iVar5 == 0) {
      TextFlow::Column::Column(&local_68,&text->name);
      local_68.m_indent = 2;
      pCVar7 = TextFlow::Column::width(&local_68,newWidth);
      TextFlow::operator<<((ostream *)&std::cout,pCVar7);
      std::operator<<((ostream *)&std::cout,'\n');
      pCVar7 = &local_68;
    }
    else {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0,
                     &text->name,":");
      TextFlow::Column::Column
                (&local_68,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0);
      local_68.m_indent = 2;
      pCVar7 = TextFlow::Column::width(&local_68,newWidth);
      TextFlow::Column::Column((Column *)(local_c0 + 0x20),&text->description);
      local_a0.m_initialIndent = 0;
      local_a0.m_indent = 2;
      other = TextFlow::Column::width((Column *)(local_c0 + 0x20),0x48 - sVar2);
      TextFlow::Column::operator+(&local_d8,pCVar7,other);
      TextFlow::operator<<((ostream *)&std::cout,&local_d8);
      std::operator<<((ostream *)&std::cout,'\n');
      std::vector<Catch::TextFlow::Column,_std::allocator<Catch::TextFlow::Column>_>::~vector
                (&local_d8.m_columns);
      std::__cxx11::string::~string((string *)(local_c0 + 0x20));
      std::__cxx11::string::~string((string *)&local_68);
      pCVar7 = (Column *)local_c0;
    }
    std::__cxx11::string::~string((string *)pCVar7);
  }
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  return;
}

Assistant:

void IStreamingReporter::listReporters(std::vector<ReporterDescription> const &descriptions, IConfig const &config) {
        Catch::cout() << "Available reporters:\n";
        const auto maxNameLen = std::max_element(descriptions.begin(), descriptions.end(),
            [](ReporterDescription const &lhs, ReporterDescription const &rhs) { return lhs.name.size() < rhs.name.size(); })
            ->name.size();

        for (auto const &desc : descriptions) {
            if (config.verbosity() == Verbosity::Quiet) {
                Catch::cout()
                    << TextFlow::Column(desc.name)
                    .indent(2)
                    .width(5 + maxNameLen) << '\n';
            }
            else {
                Catch::cout()
                    << TextFlow::Column(desc.name + ":")
                    .indent(2)
                    .width(5 + maxNameLen)
                    + TextFlow::Column(desc.description)
                    .initialIndent(0)
                    .indent(2)
                    .width(CATCH_CONFIG_CONSOLE_WIDTH - maxNameLen - 8)
                    << '\n';
            }
        }
        Catch::cout() << std::endl;
    }